

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_io.c
# Opt level: O1

int ARKStepSetStagePredictFn(void *arkode_mem,ARKStagePredictFn PredictStage)

{
  int iVar1;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeARKStepMem local_20;
  ARKodeMem local_18;
  
  iVar1 = arkStep_AccessStepMem(arkode_mem,"ARKStepSetStagePredictFn",&local_18,&local_20);
  if (iVar1 == 0) {
    if ((PredictStage == (ARKStagePredictFn)0x0) || (local_20->predictor != 5)) {
      local_20->stage_predict = PredictStage;
      iVar1 = 0;
    }
    else {
      iVar1 = -0x16;
      arkProcessError(local_18,-0x16,"ARKode::ARKStep","ARKStepSetStagePredictFn",
                      "User-supplied predictor is incompatible with predictor method 5");
    }
  }
  return iVar1;
}

Assistant:

int ARKStepSetStagePredictFn(void *arkode_mem,
                             ARKStagePredictFn PredictStage)
{
  ARKodeMem        ark_mem;
  ARKodeARKStepMem step_mem;
  int              retval;

  /* access ARKodeARKStepMem structure and set function pointer */
  retval = arkStep_AccessStepMem(arkode_mem, "ARKStepSetStagePredictFn",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) return(retval);

  /* override predictor method 5 if non-NULL PredictStage is supplied */
  if ((step_mem->predictor == 5) && (PredictStage != NULL)) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ARKStep",
                    "ARKStepSetStagePredictFn",
                    "User-supplied predictor is incompatible with predictor method 5");
    return(ARK_ILL_INPUT);
  }

  step_mem->stage_predict = PredictStage;
  return(ARK_SUCCESS);
}